

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tquant_api.h
# Opt level: O0

void __thiscall
tquant::api::CallResult<const_tquant::api::_TickArray<tquant::api::RawBar>_>::CallResult
          (CallResult<const_tquant::api::_TickArray<tquant::api::RawBar>_> *this,string *a_msg)

{
  string *a_msg_local;
  CallResult<const_tquant::api::_TickArray<tquant::api::RawBar>_> *this_local;
  
  std::shared_ptr<const_tquant::api::_TickArray<tquant::api::RawBar>_>::shared_ptr(&this->value);
  std::__cxx11::string::string((string *)&this->msg,(string *)a_msg);
  return;
}

Assistant:

CallResult(const string& a_msg)
				: msg(a_msg)
			{
			}